

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

int __thiscall kj::anon_unknown_31::WebSocketImpl::close(WebSocketImpl *this,int __fd)

{
  Disposer *pDVar1;
  void *in_RCX;
  int in_EDX;
  long in_R8;
  Promise<void> PVar2;
  ArrayPtr<const_unsigned_char> message;
  Array<unsigned_char> payload;
  Promise<void> promise;
  Exception *local_68;
  Disposer *pDStack_60;
  undefined8 *local_58;
  WebSocket local_50;
  Disposer *local_48;
  AsyncIoStream *local_40;
  
  local_68 = (Exception *)0x0;
  pDStack_60 = (Disposer *)0x0;
  local_58 = (undefined8 *)0x0;
  if (in_EDX == 0x3ed) {
    if (in_R8 != 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47]>
                ((Fault *)&stack0xffffffffffffffb0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x7da,FAILED,"reason.size() == 0",
                 "\"WebSocket close code 1005 cannot have a reason\"",
                 (char (*) [47])"WebSocket close code 1005 cannot have a reason");
      _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffb0);
    }
  }
  else {
    pDStack_60 = (Disposer *)(in_R8 + 1);
    local_68 = (Exception *)
               _::HeapArrayDisposer::allocateImpl
                         (1,(size_t)pDStack_60,(size_t)pDStack_60,(_func_void_void_ptr *)0x0,
                          (_func_void_void_ptr *)0x0);
    local_40 = (AsyncIoStream *)&_::HeapArrayDisposer::instance;
    local_58 = &_::HeapArrayDisposer::instance;
    *(char *)&(local_68->ownFile).content.ptr = (char)((uint)in_EDX >> 8);
    *(char *)((long)&(local_68->ownFile).content.ptr + 1) = (char)in_EDX;
    local_50._vptr_WebSocket = (_func_int **)local_68;
    local_48 = pDStack_60;
    memcpy((void *)((long)&(local_68->ownFile).content.ptr + 2),in_RCX,in_R8 - 1);
  }
  message.size_ = (size_t)local_68;
  message.ptr = &DAT_00000008;
  sendImpl((WebSocketImpl *)&stack0xffffffffffffffb0,(byte)__fd,message);
  PVar2 = Promise<void>::attach<kj::Array<unsigned_char>>
                    ((Promise<void> *)this,(Array<unsigned_char> *)&stack0xffffffffffffffb0);
  pDVar1 = local_48;
  if (local_48 != (Disposer *)0x0) {
    local_48 = (Disposer *)0x0;
    (**(code **)*local_50._vptr_WebSocket)
              (local_50._vptr_WebSocket,pDVar1->_vptr_Disposer[-2] + (long)&pDVar1->_vptr_Disposer,
               PVar2.super_PromiseBase.node.ptr);
  }
  if (local_68 != (Exception *)0x0) {
    (**(code **)*local_58)(local_58,local_68,1,pDStack_60,pDStack_60,0);
  }
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    kj::Array<byte> payload;
    if (code == 1005) {
      KJ_REQUIRE(reason.size() == 0, "WebSocket close code 1005 cannot have a reason");

      // code 1005 -- leave payload empty
    } else {
      payload = heapArray<byte>(reason.size() + 2);
      payload[0] = code >> 8;
      payload[1] = code;
      memcpy(payload.begin() + 2, reason.begin(), reason.size());
    }

    auto promise = sendImpl(OPCODE_CLOSE, payload);
    return promise.attach(kj::mv(payload));
  }